

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitStringTest_random_long_prefix_two_delim_Test<signed_char>::TestBody
          (WordSplitStringTest_random_long_prefix_two_delim_Test<signed_char> *this)

{
  pointer *ppuVar1;
  bool bVar2;
  char *pcVar3;
  AssertHelper local_158 [8];
  Message local_150 [8];
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  split_result;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> local_100;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> local_d0;
  undefined1 local_b0 [8];
  RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  data;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> delim;
  WordSplitStringTest_random_long_prefix_two_delim_Test<signed_char> *this_local;
  
  ppuVar1 = &data.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  make_delim_long<signed_char,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
            ((basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
              *)ppuVar1,8,'\0');
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
  basic_string(&local_d0,
               (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                *)ppuVar1);
  RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  ::RandomWordTestData
            ((RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
              *)local_b0,&local_d0,0,0);
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
  ~basic_string(&local_d0);
  ppuVar1 = &data.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::operator+((basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                  *)&split_result.
                     super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                  *)ppuVar1,
                 (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                  *)ppuVar1);
  std::operator+(&local_100,
                 (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                  *)&split_result.
                     super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                  *)&data.m_fixed_word_length);
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::operator=
            ((basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
              *)&data.m_fixed_word_length,&local_100);
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
  ~basic_string(&local_100);
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
  ~basic_string((basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                 *)&split_result.
                    super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  jessilib::
  word_split<std::vector,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_nullptr>
            ((container_type *)&gtest_ar.message_,
             (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
              *)&data.m_fixed_word_length,
             (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
              *)&data.m_token_indexes.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper::
  Compare<std::vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>,_std::vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>,_nullptr>
            ((EqHelper *)local_148,"split_result","data.m_tokens",
             (vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
              *)&gtest_ar.message_,
             (vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
              *)((long)&data.m_str.field_2 + 8));
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar2) {
    testing::Message::Message(local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x117,pcVar3);
    testing::internal::AssertHelper::operator=(local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(local_158);
    testing::Message::~Message(local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  std::
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
             *)&gtest_ar.message_);
  RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  ::~RandomWordTestData
            ((RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
              *)local_b0);
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
  ~basic_string((basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                 *)&data.m_token_indexes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TYPED_TEST(WordSplitStringTest, random_long_prefix_two_delim) {
	auto delim = make_delim_long<TypeParam>(8);
	RandomWordTestData<TypeParam> data{ delim };
	data.m_str = delim + delim + data.m_str;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(data.m_str, delim);
	EXPECT_EQ(split_result, data.m_tokens);
}